

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcold.c
# Opt level: O0

int ffgcld(fitsfile *fptr,int colnum,LONGLONG firstrow,LONGLONG firstelem,LONGLONG nelem,
          long elemincre,int nultyp,double nulval,double *array,char *nularray,int *anynul,
          int *status)

{
  int iVar1;
  long lVar2;
  long local_72c0;
  long local_72b0;
  long local_72a0;
  void *buffer;
  double cbuff [3600];
  char snull [20];
  char local_1b8 [8];
  char message [81];
  char local_158 [8];
  char tform [20];
  long local_138;
  LONGLONG maxelem;
  LONGLONG rowincre;
  LONGLONG next;
  LONGLONG remain;
  LONGLONG rownum;
  LONGLONG rowlen;
  LONGLONG tnull;
  LONGLONG readptr;
  LONGLONG elemnum;
  LONGLONG startpos;
  LONGLONG repeat;
  int local_d8;
  int readcheck;
  int nulcheck;
  int convert;
  long ntodo;
  long xwidth;
  long ii;
  long incre;
  long twidth;
  int local_a0;
  int maxelem2;
  int decimals;
  int xcode;
  int hdutype;
  int tcode;
  double dtemp;
  double power;
  double zero;
  double scale;
  double nulval_local;
  long elemincre_local;
  LONGLONG nelem_local;
  LONGLONG firstelem_local;
  LONGLONG firstrow_local;
  fitsfile *pfStack_40;
  int colnum_local;
  fitsfile *fptr_local;
  
  dtemp = 1.0;
  repeat._4_4_ = 0;
  if ((*status < 1) && (nelem != 0)) {
    if (anynul != (int *)0x0) {
      *anynul = 0;
    }
    scale = nulval;
    nulval_local = (double)elemincre;
    elemincre_local = nelem;
    nelem_local = firstelem;
    firstelem_local = firstrow;
    firstrow_local._4_4_ = colnum;
    pfStack_40 = fptr;
    if (nultyp == 2) {
      memset(nularray,0,nelem);
    }
    if ((long)nulval_local < 0) {
      repeat._4_4_ = -1;
    }
    iVar1 = ffgcprll(pfStack_40,firstrow_local._4_4_,firstelem_local,nelem_local,elemincre_local,
                     repeat._4_4_,&zero,&power,local_158,&incre,&xcode,(int *)((long)&twidth + 4),
                     &elemnum,&readptr,&ii,&startpos,&rownum,&decimals,&rowlen,
                     (char *)(cbuff + 0xe0f),status);
    if (iVar1 < 1) {
      local_138 = (long)twidth._4_4_;
      ii = (long)nulval_local * ii;
      if (xcode == 0x10) {
        ffasfm(local_158,&maxelem2,&ntodo,&local_a0,status);
        for (xwidth = 0; xwidth < local_a0; xwidth = xwidth + 1) {
          dtemp = dtemp * 10.0;
        }
      }
      local_d8 = nultyp;
      if (((nultyp != 1) || (scale != 0.0)) || (NAN(scale))) {
        if ((xcode % 10 == 1) && (rowlen == 0x4995cdd1)) {
          local_d8 = 0;
        }
        else if ((xcode == 0x15) && ((0x7fff < rowlen || (rowlen < -0x8000)))) {
          local_d8 = 0;
        }
        else if ((xcode == 0xb) && ((0xff < rowlen || (rowlen < 0)))) {
          local_d8 = 0;
        }
        else if ((xcode == 0x10) && (cbuff[0xe0f]._0_1_ == '\x01')) {
          local_d8 = 0;
        }
      }
      else {
        local_d8 = 0;
      }
      readcheck = 1;
      if (xcode == 0x52) {
        if (elemincre_local < 0xfffffff) {
          local_138 = elemincre_local;
        }
        else {
          local_138 = 0xfffffff;
        }
        if ((((local_d8 == 0) && (zero == 1.0)) && (!NAN(zero))) &&
           ((power == 0.0 && (!NAN(power))))) {
          readcheck = 0;
        }
      }
      next = elemincre_local;
      rowincre = 0;
      remain = 0;
      while (next != 0) {
        if (next < local_138) {
          local_72a0 = next;
        }
        else {
          local_72a0 = local_138;
        }
        if ((long)nulval_local < 0) {
          if (local_72a0 < readptr / -(long)nulval_local + 1) {
            local_72c0 = local_72a0;
          }
          else {
            local_72c0 = readptr / -(long)nulval_local + 1;
          }
          _nulcheck = local_72c0;
        }
        else {
          if (local_72a0 < ((startpos - readptr) + -1) / (long)nulval_local + 1) {
            local_72b0 = local_72a0;
          }
          else {
            local_72b0 = ((startpos - readptr) + -1) / (long)nulval_local + 1;
          }
          _nulcheck = local_72b0;
        }
        tnull = elemnum + remain * rownum + readptr * (ii / (long)nulval_local);
        if (xcode == 0xb) {
          ffgi1b(pfStack_40,tnull,_nulcheck,ii,(uchar *)&buffer,status);
          fffi1r8((uchar *)&buffer,_nulcheck,zero,power,local_d8,(uchar)rowlen,scale,
                  nularray + rowincre,anynul,array + rowincre,status);
        }
        else if (xcode == 0x10) {
          ffmbyt(pfStack_40,tnull,0,status);
          if (ii == incre) {
            ffgbyt(pfStack_40,_nulcheck * incre,&buffer,status);
          }
          else {
            ffgbytoff(pfStack_40,incre,_nulcheck,ii - incre,&buffer,status);
          }
          fffstrr8((char *)&buffer,_nulcheck,zero,power,incre,dtemp,local_d8,(char *)(cbuff + 0xe0f)
                   ,scale,nularray + rowincre,anynul,array + rowincre,status);
        }
        else if (xcode == 0x15) {
          ffgi2b(pfStack_40,tnull,_nulcheck,ii,(short *)&buffer,status);
          fffi2r8((short *)&buffer,_nulcheck,zero,power,local_d8,(short)rowlen,scale,
                  nularray + rowincre,anynul,array + rowincre,status);
        }
        else if (xcode == 0x29) {
          ffgi4b(pfStack_40,tnull,_nulcheck,ii,(int *)&buffer,status);
          fffi4r8((int *)&buffer,_nulcheck,zero,power,local_d8,(int)rowlen,scale,nularray + rowincre
                  ,anynul,array + rowincre,status);
        }
        else if (xcode == 0x2a) {
          ffgr4b(pfStack_40,tnull,_nulcheck,ii,(float *)&buffer,status);
          fffr4r8((float *)&buffer,_nulcheck,zero,power,local_d8,scale,nularray + rowincre,anynul,
                  array + rowincre,status);
        }
        else if (xcode == 0x51) {
          ffgi8b(pfStack_40,tnull,_nulcheck,ii,(long *)&buffer,status);
          fffi8r8((LONGLONG *)&buffer,_nulcheck,zero,power,local_d8,rowlen,scale,nularray + rowincre
                  ,anynul,array + rowincre,status);
        }
        else {
          if (xcode != 0x52) {
            snprintf(local_1b8,0x51,"Cannot read numbers from column %d which has format %s",
                     (ulong)firstrow_local._4_4_,local_158);
            ffpmsg(local_1b8);
            if (decimals == 1) {
              *status = 0x137;
              return 0x137;
            }
            *status = 0x138;
            return 0x138;
          }
          ffgr8b(pfStack_40,tnull,_nulcheck,ii,array + rowincre,status);
          if (readcheck != 0) {
            fffr8r8(array + rowincre,_nulcheck,zero,power,local_d8,scale,nularray + rowincre,anynul,
                    array + rowincre,status);
          }
        }
        if (0 < *status) {
          _hdutype = (double)rowincre;
          if (decimals < 1) {
            snprintf(local_1b8,0x51,"Error reading elements %.0f thru %.0f from image (ffgcld).",
                     _hdutype + 1.0,_hdutype + (double)_nulcheck);
          }
          else {
            snprintf(local_1b8,0x51,"Error reading elements %.0f thru %.0f from column %d (ffgcld)."
                     ,_hdutype + 1.0,_hdutype + (double)_nulcheck,(ulong)firstrow_local._4_4_);
          }
          ffpmsg(local_1b8);
          return *status;
        }
        next = next - _nulcheck;
        if (next != 0) {
          rowincre = _nulcheck + rowincre;
          readptr = readptr + _nulcheck * (long)nulval_local;
          if (readptr < startpos) {
            if (readptr < 0) {
              lVar2 = (-1 - readptr) / startpos + 1;
              remain = remain - lVar2;
              readptr = lVar2 * startpos + readptr;
            }
          }
          else {
            remain = readptr / startpos + remain;
            readptr = readptr - (readptr / startpos) * startpos;
          }
        }
      }
      if (*status == -0xb) {
        ffpmsg("Numerical overflow during type conversion while reading FITS data.");
        *status = 0x19c;
      }
      fptr_local._4_4_ = *status;
    }
    else {
      fptr_local._4_4_ = *status;
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffgcld( fitsfile *fptr,   /* I - FITS file pointer                       */
            int  colnum,      /* I - number of column to read (1 = 1st col)  */
            LONGLONG  firstrow,   /* I - first row to read (1 = 1st row)         */
            LONGLONG firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            long  elemincre,  /* I - pixel increment; e.g., 2 = every other  */
            int   nultyp,     /* I - null value handling code:               */
                              /*     1: set undefined pixels = nulval        */
                              /*     2: set nularray=1 for undefined pixels  */
            double nulval,    /* I - value for null pixels if nultyp = 1     */
            double *array,    /* O - array of values that are read           */
            char *nularray,   /* O - array of flags = 1 if nultyp = 2        */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from a column in the current FITS HDU.
  The column number may refer to a real column in an ASCII or binary table, 
  or it may refer be a virtual column in a 1 or more grouped FITS primary
  array or image extension.  FITSIO treats a primary array as a binary table
  with 2 vector columns: the first column contains the group parameters (often
  with length = 0) and the second column contains the array of image pixels.
  Each row of the table represents a group in the case of multigroup FITS
  images.

  The output array of values will be converted from the datatype of the column
  and will be scaled by the FITS TSCALn and TZEROn values if necessary.
*/
{
    double scale, zero, power = 1, dtemp;
    int tcode, hdutype, xcode, decimals, maxelem2;
    long twidth, incre;
    long ii, xwidth, ntodo;
    int convert, nulcheck, readcheck = 0;
    LONGLONG repeat, startpos, elemnum, readptr, tnull;
    LONGLONG rowlen, rownum, remain, next, rowincre, maxelem;
    char tform[20];
    char message[FLEN_ERRMSG];
    char snull[20];   /*  the FITS null value if reading from ASCII table  */

    double cbuff[DBUFFSIZE / sizeof(double)]; /* align cbuff on word boundary */
    void *buffer;

    if (*status > 0 || nelem == 0)  /* inherit input status value if > 0 */
        return(*status);

    buffer = cbuff;

    if (anynul)
        *anynul = 0;

    if (nultyp == 2)
        memset(nularray, 0, (size_t) nelem);   /* initialize nullarray */

    /*---------------------------------------------------*/
    /*  Check input and get parameters about the column: */
    /*---------------------------------------------------*/
    if (elemincre < 0)
        readcheck = -1;  /* don't do range checking in this case */

    if ( ffgcprll( fptr, colnum, firstrow, firstelem, nelem, readcheck, &scale, &zero,
         tform, &twidth, &tcode, &maxelem2, &startpos, &elemnum, &incre,
         &repeat, &rowlen, &hdutype, &tnull, snull, status) > 0 )
         return(*status);
    maxelem = maxelem2;

    incre *= elemincre;   /* multiply incre to just get every nth pixel */

    if (tcode == TSTRING)    /* setup for ASCII tables */
    {
      /* get the number of implied decimal places if no explicit decmal point */
      ffasfm(tform, &xcode, &xwidth, &decimals, status); 
      for(ii = 0; ii < decimals; ii++)
        power *= 10.;
    }

    /*------------------------------------------------------------------*/
    /*  Decide whether to check for null values in the input FITS file: */
    /*------------------------------------------------------------------*/
    nulcheck = nultyp; /* by default check for null values in the FITS file */

    if (nultyp == 1 && nulval == 0)
       nulcheck = 0;    /* calling routine does not want to check for nulls */

    else if (tcode%10 == 1 &&        /* if reading an integer column, and  */ 
            tnull == NULL_UNDEFINED) /* if a null value is not defined,    */
            nulcheck = 0;            /* then do not check for null values. */

    else if (tcode == TSHORT && (tnull > SHRT_MAX || tnull < SHRT_MIN) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TBYTE && (tnull > 255 || tnull < 0) )
            nulcheck = 0;            /* Impossible null value */

    else if (tcode == TSTRING && snull[0] == ASCII_NULL_UNDEFINED)
         nulcheck = 0;

    /*----------------------------------------------------------------------*/
    /*  If FITS column and output data array have same datatype, then we do */
    /*  not need to use a temporary buffer to store intermediate datatype.  */
    /*----------------------------------------------------------------------*/
    convert = 1;
    if (tcode == TDOUBLE) /* Special Case:                        */
    {                              /* no type convertion required, so read */
                                  /* data directly into output buffer.    */

        if (nelem < (LONGLONG)INT32_MAX/8) {
            maxelem = nelem;
        } else {
            maxelem = INT32_MAX/8;
        }

        if (nulcheck == 0 && scale == 1. && zero == 0.)
            convert = 0;  /* no need to scale data or find nulls */
    }

    /*---------------------------------------------------------------------*/
    /*  Now read the pixels from the FITS column. If the column does not   */
    /*  have the same datatype as the output array, then we have to read   */
    /*  the raw values into a temporary buffer (of limited size).  In      */
    /*  the case of a vector colum read only 1 vector of values at a time  */
    /*  then skip to the next row if more values need to be read.          */
    /*  After reading the raw values, then call the fffXXYY routine to (1) */
    /*  test for undefined values, (2) convert the datatype if necessary,  */
    /*  and (3) scale the values by the FITS TSCALn and TZEROn linear      */
    /*  scaling parameters.                                                */
    /*---------------------------------------------------------------------*/
    remain = nelem;           /* remaining number of values to read */
    next = 0;                 /* next element in array to be read   */
    rownum = 0;               /* row number, relative to firstrow   */

    while (remain)
    {
        /* limit the number of pixels to read at one time to the number that
           will fit in the buffer or to the number of pixels that remain in
           the current vector, which ever is smaller.
        */
        ntodo = (long) minvalue(remain, maxelem);
        if (elemincre >= 0)
        {
          ntodo = (long) minvalue(ntodo, ((repeat - elemnum - 1)/elemincre +1));
        }
        else
        {
          ntodo = (long) minvalue(ntodo, (elemnum/(-elemincre) +1));
        }

        readptr = startpos + ((LONGLONG)rownum * rowlen) + (elemnum * (incre / elemincre));

        switch (tcode) 
        {
            case (TDOUBLE):
                ffgr8b(fptr, readptr, ntodo, incre, &array[next], status);
                if (convert)
                    fffr8r8(&array[next], ntodo, scale, zero, nulcheck, 
                           nulval, &nularray[next], anynul, 
                           &array[next], status);
                break;
            case (TBYTE):
                ffgi1b(fptr, readptr, ntodo, incre, (unsigned char *) buffer,
                       status);
                fffi1r8((unsigned char *) buffer, ntodo, scale, zero, nulcheck, 
                   (unsigned char) tnull, nulval, &nularray[next], anynul, 
                   &array[next], status);
                break;
            case (TSHORT):
                ffgi2b(fptr, readptr, ntodo, incre, (short  *) buffer, status);
                fffi2r8((short  *) buffer, ntodo, scale, zero, nulcheck, 
                    (short) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONG):
                ffgi4b(fptr, readptr, ntodo, incre, (INT32BIT *) buffer,
                       status);
                fffi4r8((INT32BIT *) buffer, ntodo, scale, zero, nulcheck, 
                       (INT32BIT) tnull, nulval, &nularray[next], anynul, 
                       &array[next], status);
                break;
            case (TLONGLONG):
                ffgi8b(fptr, readptr, ntodo, incre, (long *) buffer, status);
                fffi8r8( (LONGLONG *) buffer, ntodo, scale, zero, 
                           nulcheck, tnull, nulval, &nularray[next], 
                            anynul, &array[next], status);
                break;
            case (TFLOAT):
                ffgr4b(fptr, readptr, ntodo, incre, (float  *) buffer, status);
                fffr4r8((float  *) buffer, ntodo, scale, zero, nulcheck, 
                          nulval, &nularray[next], anynul, 
                          &array[next], status);
                break;
            case (TSTRING):
                ffmbyt(fptr, readptr, REPORT_EOF, status);
       
                if (incre == twidth)    /* contiguous bytes */
                     ffgbyt(fptr, ntodo * twidth, buffer, status);
                else
                     ffgbytoff(fptr, twidth, ntodo, incre - twidth, buffer,
                               status);

                fffstrr8((char *) buffer, ntodo, scale, zero, twidth, power,
                     nulcheck, snull, nulval, &nularray[next], anynul,
                     &array[next], status);
                break;


            default:  /*  error trap for invalid column format */
                snprintf(message, FLEN_ERRMSG,
                   "Cannot read numbers from column %d which has format %s",
                    colnum, tform);
                ffpmsg(message);
                if (hdutype == ASCII_TBL)
                    return(*status = BAD_ATABLE_FORMAT);
                else
                    return(*status = BAD_BTABLE_FORMAT);

        } /* End of switch block */

        /*-------------------------*/
        /*  Check for fatal error  */
        /*-------------------------*/
        if (*status > 0)  /* test for error during previous read operation */
        {
	  dtemp = (double) next;
          if (hdutype > 0)
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from column %d (ffgcld).",
              dtemp+1., dtemp+ntodo, colnum);
          else
            snprintf(message,FLEN_ERRMSG,
            "Error reading elements %.0f thru %.0f from image (ffgcld).",
              dtemp+1., dtemp+ntodo);

          ffpmsg(message);
          return(*status);
        }

        /*--------------------------------------------*/
        /*  increment the counters for the next loop  */
        /*--------------------------------------------*/
        remain -= ntodo;
        if (remain)
        {
            next += ntodo;
            elemnum = elemnum + (ntodo * elemincre);

            if (elemnum >= repeat)  /* completed a row; start on later row */
            {
                rowincre = (long) (elemnum / repeat);
                rownum += rowincre;
                elemnum = elemnum - (rowincre * repeat);
            }
            else if (elemnum < 0)  /* completed a row; start on a previous row */
            {
                rowincre = (long) ((-elemnum - 1) / repeat + 1);
                rownum -= rowincre;
                elemnum = (rowincre * repeat) + elemnum;
            }
        }
    }  /*  End of main while Loop  */


    /*--------------------------------*/
    /*  check for numerical overflow  */
    /*--------------------------------*/
    if (*status == OVERFLOW_ERR)
    {
        ffpmsg(
        "Numerical overflow during type conversion while reading FITS data.");
        *status = NUM_OVERFLOW;
    }

    return(*status);
}